

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O0

bool parseCommandLine(CommandLine *cmdLine,int argc,char **argv)

{
  bool bVar1;
  deBool dVar2;
  Error *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  ostream *poVar4;
  ValueType *pVVar5;
  ValueType *pVVar6;
  ValueType *pVVar7;
  undefined1 local_88 [8];
  CommandLine opts;
  Parser parser;
  char **argv_local;
  int argc_local;
  CommandLine *cmdLine_local;
  
  de::cmdline::detail::Parser::Parser
            ((Parser *)
             &opts.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  de::cmdline::detail::CommandLine::CommandLine((CommandLine *)local_88);
  do {
    dVar2 = deGetFalse();
    if (dVar2 != 0 || argc < 1) {
      this = (Error *)__cxa_allocate_exception(0x10);
      xe::Error::Error(this,(char *)0x0,"argc >= 1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeTestLogCompare.cpp"
                       ,0x174);
      __cxa_throw(this,&xe::Error::typeinfo,xe::Error::~Error);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  opt::registerOptions
            ((Parser *)
             &opts.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = de::cmdline::detail::Parser::parse
                    ((Parser *)
                     &opts.m_args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,argc + -1,argv + 1,
                     (CommandLine *)local_88,(ostream *)&std::cerr);
  if (bVar1) {
    pvVar3 = de::cmdline::detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)local_88);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(pvVar3);
    if (!bVar1) {
      pVVar5 = de::cmdline::detail::CommandLine::getOption<opt::OutFormat>((CommandLine *)local_88);
      cmdLine->outFormat = *pVVar5;
      pVVar6 = de::cmdline::detail::CommandLine::getOption<opt::OutMode>((CommandLine *)local_88);
      cmdLine->outMode = *pVVar6;
      pVVar7 = de::cmdline::detail::CommandLine::getOption<opt::OutValue>((CommandLine *)local_88);
      cmdLine->outValue = *pVVar7;
      pvVar3 = de::cmdline::detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&cmdLine->filenames,pvVar3);
      cmdLine_local._7_1_ = true;
      goto LAB_00137d7e;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,*argv);
  std::operator<<(poVar4,": [options] [filenames]\n");
  de::cmdline::detail::Parser::help
            ((Parser *)
             &opts.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ostream *)&std::cout);
  cmdLine_local._7_1_ = false;
LAB_00137d7e:
  de::cmdline::detail::CommandLine::~CommandLine((CommandLine *)local_88);
  de::cmdline::detail::Parser::~Parser
            ((Parser *)
             &opts.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return cmdLine_local._7_1_;
}

Assistant:

static bool parseCommandLine (CommandLine& cmdLine, int argc, const char* const* argv)
{
	de::cmdline::Parser			parser;
	de::cmdline::CommandLine	opts;

	XE_CHECK(argc >= 1);

	opt::registerOptions(parser);

	if (!parser.parse(argc-1, &argv[1], &opts, std::cerr)	||
		opts.getArgs().empty())
	{
		std::cout << argv[0] << ": [options] [filenames]\n";
		parser.help(std::cout);
		return false;
	}

	cmdLine.outFormat	= opts.getOption<opt::OutFormat>();
	cmdLine.outMode		= opts.getOption<opt::OutMode>();
	cmdLine.outValue	= opts.getOption<opt::OutValue>();
	cmdLine.filenames	= opts.getArgs();

	return true;
}